

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O2

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::TransformedPrimitive::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,TransformedPrimitive *this,
          Ray *r,Float tMax)

{
  Transform *this_00;
  ShapeIntersection *pSVar1;
  ShapeIntersection *pSVar2;
  type tVar3;
  Float va;
  Float tMax_local;
  double vb;
  Interval IStack_240;
  Interval IStack_238;
  Float FStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  Tuple3<pbrt::Normal3,_float> aTStack_220 [2];
  MediumInterface *local_208;
  MediumHandle local_200;
  Tuple3<pbrt::Vector3,_float> local_1f8 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_1e0 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_1c8 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_1b0 [2];
  Tuple3<pbrt::Normal3,_float> TStack_198;
  MaterialHandle local_188;
  LightHandle LStack_180;
  Tuple3<pbrt::Vector3,_float> local_178 [3];
  Float FStack_154;
  optional<pbrt::ShapeIntersection> si;
  Ray ray;
  
  tMax_local = tMax;
  Transform::ApplyInverse(&ray,*(Transform **)(this + 8),r,&tMax_local);
  PrimitiveHandle::Intersect(&si,(PrimitiveHandle *)this,&ray,tMax_local);
  if (si.set == false) {
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    pSVar1 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    va = pSVar1->tHit;
    vb = (double)tMax_local * 1.001;
    if (vb <= (double)va) {
      LogFatal<char_const(&)[9],char_const(&)[13],char_const(&)[9],float&,char_const(&)[13],double&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/primitive.cpp"
                 ,0x80,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [9])"si->tHit",
                 (char (*) [13])"1.001 * tMax",(char (*) [9])"si->tHit",&va,
                 (char (*) [13])"1.001 * tMax",&vb);
    }
    this_00 = *(Transform **)(this + 8);
    pSVar1 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    Transform::operator()((SurfaceInteraction *)&vb,this_00,&pSVar1->intr);
    pSVar1 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    (pSVar1->intr).super_Interaction.mediumInterface = local_208;
    (pSVar1->intr).super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = (Interval)vb;
    (pSVar1->intr).super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y = IStack_240;
    (pSVar1->intr).super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z = IStack_238;
    (pSVar1->intr).super_Interaction.time = FStack_230;
    (pSVar1->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = fStack_22c;
    (pSVar1->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = fStack_228;
    (pSVar1->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = fStack_224;
    (pSVar1->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = aTStack_220[0].x;
    (pSVar1->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = aTStack_220[0].y;
    *(undefined8 *)&(pSVar1->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
         aTStack_220._8_8_;
    *(undefined8 *)&(pSVar1->intr).super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
         aTStack_220[1]._4_8_;
    (pSVar1->intr).super_Interaction.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (uintptr_t)
            local_200.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
    (pSVar1->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.x = aTStack_1c8[0].x;
    (pSVar1->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.y = aTStack_1c8[0].y;
    *(undefined8 *)&(pSVar1->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.z =
         aTStack_1c8._8_8_;
    (pSVar1->intr).shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y = aTStack_1c8[1].y;
    (pSVar1->intr).shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.z = aTStack_1c8[1].z;
    (pSVar1->intr).shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x = aTStack_1b0[0].x;
    (pSVar1->intr).shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y = aTStack_1b0[0].y;
    *(undefined8 *)&(pSVar1->intr).shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
         aTStack_1b0._8_8_;
    (pSVar1->intr).shading.dndu.super_Tuple3<pbrt::Normal3,_float>.y = aTStack_1b0[1].y;
    (pSVar1->intr).shading.dndu.super_Tuple3<pbrt::Normal3,_float>.z = aTStack_1b0[1].z;
    (pSVar1->intr).shading.dndv.super_Tuple3<pbrt::Normal3,_float>.x = TStack_198.x;
    (pSVar1->intr).shading.dndv.super_Tuple3<pbrt::Normal3,_float>.y = TStack_198.y;
    *(undefined8 *)&(pSVar1->intr).shading.dndv.super_Tuple3<pbrt::Normal3,_float>.z =
         stack0xfffffffffffffe70;
    (pSVar1->intr).dpdu.super_Tuple3<pbrt::Vector3,_float>.x = local_1f8[0].x;
    (pSVar1->intr).dpdu.super_Tuple3<pbrt::Vector3,_float>.y = local_1f8[0].y;
    *(undefined8 *)&(pSVar1->intr).dpdu.super_Tuple3<pbrt::Vector3,_float>.z = local_1f8._8_8_;
    (pSVar1->intr).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = local_1f8[1].y;
    (pSVar1->intr).dpdv.super_Tuple3<pbrt::Vector3,_float>.z = local_1f8[1].z;
    (pSVar1->intr).dndu.super_Tuple3<pbrt::Normal3,_float>.x = aTStack_1e0[0].x;
    (pSVar1->intr).dndu.super_Tuple3<pbrt::Normal3,_float>.y = aTStack_1e0[0].y;
    *(undefined8 *)&(pSVar1->intr).dndu.super_Tuple3<pbrt::Normal3,_float>.z = aTStack_1e0._8_8_;
    (pSVar1->intr).dndv.super_Tuple3<pbrt::Normal3,_float>.y = aTStack_1e0[1].y;
    (pSVar1->intr).dndv.super_Tuple3<pbrt::Normal3,_float>.z = aTStack_1e0[1].z;
    (pSVar1->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.x = aTStack_1c8[0].x;
    (pSVar1->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.y = aTStack_1c8[0].y;
    *(undefined8 *)&(pSVar1->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.z =
         aTStack_1c8._8_8_;
    (pSVar1->intr).material.
    super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
    .bits = (uintptr_t)
            local_188.
            super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            .bits;
    (pSVar1->intr).areaLight.
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    .bits = (uintptr_t)
            LStack_180.
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            .bits;
    (pSVar1->intr).dudy = local_178[2].z;
    (pSVar1->intr).dvdy = FStack_154;
    (pSVar1->intr).dpdx.super_Tuple3<pbrt::Vector3,_float>.x = local_178[0].x;
    (pSVar1->intr).dpdx.super_Tuple3<pbrt::Vector3,_float>.y = local_178[0].y;
    *(undefined8 *)&(pSVar1->intr).dpdx.super_Tuple3<pbrt::Vector3,_float>.z = local_178._8_8_;
    (pSVar1->intr).dpdy.super_Tuple3<pbrt::Vector3,_float>.y = local_178[1].y;
    (pSVar1->intr).dpdy.super_Tuple3<pbrt::Vector3,_float>.z = local_178[1].z;
    (pSVar1->intr).dudx = local_178[2].x;
    (pSVar1->intr).dvdx = local_178[2].y;
    pSVar1 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    pSVar2 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    tVar3 = Dot<float>(&(pSVar1->intr).super_Interaction.n,&(pSVar2->intr).shading.n);
    va = 0.0;
    vb = (double)CONCAT44(vb._4_4_,tVar3);
    if (tVar3 < 0.0) {
      LogFatal<char_const(&)[36],char_const(&)[2],char_const(&)[36],float&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/primitive.cpp"
                 ,0x84,"Check failed: %s >= %s with %s = %s, %s = %s",
                 (char (*) [36])"Dot(si->intr.n, si->intr.shading.n)",(char (*) [2])0x53f2eb,
                 (char (*) [36])"Dot(si->intr.n, si->intr.shading.n)",(float *)&vb,
                 (char (*) [2])0x53f2eb,(int *)&va);
    }
    pstd::optional<pbrt::ShapeIntersection>::optional(__return_storage_ptr__,&si);
  }
  pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> TransformedPrimitive::Intersect(const Ray &r,
                                                                  Float tMax) const {
    // Transform ray to primitive-space and intersect with primitive
    Ray ray = renderFromPrimitive->ApplyInverse(r, &tMax);
    pstd::optional<ShapeIntersection> si = primitive.Intersect(ray, tMax);
    if (!si)
        return {};
    CHECK_LT(si->tHit, 1.001 * tMax);

    // Return transformed instance's intersection information
    si->intr = (*renderFromPrimitive)(si->intr);
    CHECK_GE(Dot(si->intr.n, si->intr.shading.n), 0);
    return si;
}